

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

ssize_t __thiscall
httplib::detail::SocketStream::read(SocketStream *this,int __fd,void *__buf,size_t __nbytes)

{
  anon_class_24_3_c2b06966 fn;
  int iVar1;
  ssize_t sVar2;
  undefined4 in_register_00000034;
  size_t size_local;
  char *ptr_local;
  SocketStream *local_20;
  char **ppcStack_18;
  size_t *local_10;
  
  ptr_local = (char *)CONCAT44(in_register_00000034,__fd);
  size_local = (size_t)__buf;
  iVar1 = (*(this->super_Stream)._vptr_Stream[2])();
  if ((char)iVar1 == '\0') {
    sVar2 = -1;
  }
  else {
    ppcStack_18 = &ptr_local;
    local_10 = &size_local;
    fn.ptr = (char **)ptr_local;
    fn.this = (SocketStream *)size_local;
    fn.size = (size_t *)this;
    local_20 = this;
    sVar2 = handle_EINTR<httplib::detail::SocketStream::read(char*,unsigned_long)::_lambda()_1_>(fn)
    ;
  }
  return sVar2;
}

Assistant:

inline ssize_t SocketStream::read(char *ptr, size_t size) {
			if (!is_readable()) { return -1; }

#ifdef _WIN32
			if (size > static_cast<size_t>((std::numeric_limits<int>::max)())) {
    return -1;
  }
  return recv(sock_, ptr, static_cast<int>(size), CPPHTTPLIB_RECV_FLAGS);
#else
			return handle_EINTR(
					[&]() { return recv(sock_, ptr, size, CPPHTTPLIB_RECV_FLAGS); });
#endif
		}